

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.h
# Opt level: O0

void __thiscall Assimp::ImporterPimpl::ImporterPimpl(ImporterPimpl *this)

{
  ImporterPimpl *this_local;
  
  this->mIOHandler = (IOSystem *)0x0;
  this->mIsDefaultHandler = false;
  this->mProgressHandler = (ProgressHandler *)0x0;
  this->mIsDefaultProgressHandler = false;
  memset(&this->mImporter,0,0x18);
  std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::vector
            (&this->mImporter);
  memset(&this->mPostProcessingSteps,0,0x18);
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::vector
            (&this->mPostProcessingSteps);
  this->mScene = (aiScene *)0x0;
  std::__cxx11::string::string((string *)&this->mErrorString);
  memset(&this->mIntProperties,0,0x30);
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::map(&this->mIntProperties);
  memset(&this->mFloatProperties,0,0x30);
  std::
  map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  ::map(&this->mFloatProperties);
  memset(&this->mStringProperties,0,0x30);
  std::
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->mStringProperties);
  memset(&this->mMatrixProperties,0,0x30);
  std::
  map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  ::map(&this->mMatrixProperties);
  this->bExtraVerbose = false;
  this->mPPShared = (SharedPostProcessInfo *)0x0;
  return;
}

Assistant:

inline
ImporterPimpl::ImporterPimpl() AI_NO_EXCEPT
: mIOHandler( nullptr )
, mIsDefaultHandler( false )
, mProgressHandler( nullptr )
, mIsDefaultProgressHandler( false )
, mImporter()
, mPostProcessingSteps()
, mScene( nullptr )
, mErrorString()
, mIntProperties()
, mFloatProperties()
, mStringProperties()
, mMatrixProperties()
, bExtraVerbose( false )
, mPPShared( nullptr ) {
    // empty
}